

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominance.cpp
# Opt level: O0

int __thiscall mocker::DominatorTree::init(DominatorTree *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  BasicBlockList *this_00;
  mapped_type *pmVar2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar3;
  mapped_type *pmVar4;
  byte in_DL;
  initializer_list<unsigned_long> local_68;
  initializer_list<unsigned_long> local_58;
  size_t local_48;
  size_t label;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  bool reverse__local;
  FunctionModule *func_local;
  DominatorTree *this_local;
  
  this->reverse = (bool)(in_DL & 1);
  this_00 = ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)ctx);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar1) break;
    label = (size_t)std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    local_48 = ir::BasicBlock::getLabelID((BasicBlock *)label);
    std::initializer_list<unsigned_long>::initializer_list(&local_58);
    pmVar2 = std::
             unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&this->dominators,&local_48);
    puVar3 = std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::operator=(pmVar2,local_58);
    pmVar2 = std::
             unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&this->dominating,&local_48);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operator=(pmVar2,puVar3);
    pmVar4 = std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->immediateDominator,&local_48);
    *pmVar4 = 0xffffffffffffffff;
    std::initializer_list<unsigned_long>::initializer_list(&local_68);
    pmVar2 = std::
             unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&this->dominanceFrontier,&local_48);
    puVar3 = std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::operator=(pmVar2,local_68);
    pmVar2 = std::
             unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
             ::operator[](&this->dominatorTree,&local_48);
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::operator=(pmVar2,puVar3);
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  }
  buildDominating(this,(FunctionModule *)ctx);
  buildDominators(this);
  buildImmediateDominator(this,(FunctionModule *)ctx);
  buildDominatorTree(this);
  buildDominanceFrontier(this,(FunctionModule *)ctx);
  return extraout_EAX;
}

Assistant:

void DominatorTree::init(const ir::FunctionModule &func, bool reverse_) {
  reverse = reverse_;
  for (auto &bb : func.getBBs()) {
    auto label = bb.getLabelID();
    dominating[label] = dominators[label] = {};
    immediateDominator[label] = (std::size_t)-1;
    dominatorTree[label] = dominanceFrontier[label] = {};
  }
  buildDominating(func);
  buildDominators();
  buildImmediateDominator(func);
  buildDominatorTree();
  buildDominanceFrontier(func);
}